

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cloud.c
# Opt level: O1

CloudNode * Cloud_MakeNode(CloudManager *dd,CloudVar v,CloudNode *t,CloudNode *e)

{
  CloudNode *pCVar1;
  
  pCVar1 = dd->tUnique;
  if ((t < pCVar1) || (pCVar1 + dd->nNodesAlloc <= t)) {
    __assert_fail("(t) >= dd->tUnique && (t) < dd->tUnique+dd->nNodesAlloc",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/cloud.c"
                  ,0x101,
                  "CloudNode *Cloud_MakeNode(CloudManager *, CloudVar, CloudNode *, CloudNode *)");
  }
  if ((pCVar1 <= e) && (e < pCVar1 + dd->nNodesAlloc)) {
    if ((v < ((CloudNode *)((ulong)t & 0xfffffffffffffffe))->v) &&
       (v < *(uint *)(((ulong)e & 0xfffffffffffffffe) + 4))) {
      if (((ulong)t & 1) == 0) {
        pCVar1 = cloudMakeNode(dd,v,t,e);
        return pCVar1;
      }
      pCVar1 = cloudMakeNode(dd,v,(CloudNode *)((ulong)t & 0xfffffffffffffffe),
                             (CloudNode *)((ulong)e ^ 1));
      if (pCVar1 == (CloudNode *)0x0) {
        pCVar1 = (CloudNode *)0x0;
      }
      else {
        pCVar1 = (CloudNode *)((ulong)pCVar1 ^ 1);
      }
      return pCVar1;
    }
    __assert_fail("v < Cloud_V(t) && v < Cloud_V(e)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/cloud.c"
                  ,0x103,
                  "CloudNode *Cloud_MakeNode(CloudManager *, CloudVar, CloudNode *, CloudNode *)");
  }
  __assert_fail("(e) >= dd->tUnique && (e) < dd->tUnique+dd->nNodesAlloc",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/cloud.c"
                ,0x102,
                "CloudNode *Cloud_MakeNode(CloudManager *, CloudVar, CloudNode *, CloudNode *)");
}

Assistant:

CloudNode * Cloud_MakeNode( CloudManager * dd, CloudVar v, CloudNode * t, CloudNode * e )
{
	CloudNode * pRes;
	CLOUD_ASSERT(t); 
	CLOUD_ASSERT(e);
    assert( v < Cloud_V(t) && v < Cloud_V(e) );       // variable should be above in the order
    if ( Cloud_IsComplement(t) )
    {
        pRes = cloudMakeNode( dd, v, Cloud_Not(t), Cloud_Not(e) );
        if ( pRes != NULL )
            pRes = Cloud_Not(pRes);            
    }
    else
        pRes = cloudMakeNode( dd, v, t, e );
    return pRes;
}